

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O3

char * sfnt_get_ps_name(TT_Face face)

{
  byte *pbVar1;
  char cVar2;
  FT_UInt FVar3;
  FT_Memory pFVar4;
  TT_NameRec *pTVar5;
  FT_Stream pFVar6;
  void *pvVar7;
  FT_Memory memory;
  FT_Bool FVar8;
  uint uVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined8 uVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  byte *pbVar25;
  int *piVar26;
  ulong uVar27;
  long lVar28;
  byte *pbVar29;
  char *pcVar30;
  long lVar31;
  bool bVar32;
  char *local_78 [2];
  undefined8 local_68;
  FT_Int win;
  uint local_5c [3];
  long lStack_50;
  FT_Error error;
  FT_MM_Var *mm_var;
  FT_Int apple;
  uint local_3c;
  int local_38;
  FT_UInt num_coords;
  FT_Int win_1;
  FT_Int apple_1;
  
  if (face->postscript_name != (char *)0x0) {
    return face->postscript_name;
  }
  if ((face->blend == (GX_Blend)0x0) ||
     ((((face->root).face_index & 0x7fff0000) == 0 && (((face->root).face_flags & 0x8000) == 0)))) {
    FVar8 = sfnt_get_name_id(face,6,(FT_Int *)&local_68,(FT_Int *)&mm_var);
    if (FVar8 == '\0') {
      return (char *)0x0;
    }
    pFVar4 = (face->root).memory;
    pTVar5 = (face->name_table).names;
    pFVar6 = (face->name_table).stream;
    if ((long)(int)local_68 == -1) {
      pcVar10 = get_apple_string(pFVar4,pFVar6,pTVar5 + (int)mm_var,sfnt_is_postscript,'\x01');
    }
    else {
      pcVar10 = get_win_string(pFVar4,pFVar6,pTVar5 + (int)local_68,sfnt_is_postscript,'\x01');
    }
    goto LAB_0021eb2e;
  }
  pFVar4 = (face->root).memory;
  pvVar7 = face->mm;
  if (face->var_postscript_prefix == (char *)0x0) {
    FVar8 = sfnt_get_name_id(face,0x19,&local_38,(FT_Int *)&num_coords);
    if (((FVar8 != '\0') ||
        (FVar8 = sfnt_get_name_id(face,0x10,&local_38,(FT_Int *)&num_coords), FVar8 != '\0')) ||
       (FVar8 = sfnt_get_name_id(face,1,&local_38,(FT_Int *)&num_coords), FVar8 != '\0')) {
      memory = (face->root).memory;
      pTVar5 = (face->name_table).names;
      pFVar6 = (face->name_table).stream;
      if ((long)local_38 == -1) {
        pcVar10 = get_apple_string(memory,pFVar6,pTVar5 + (int)num_coords,sfnt_is_alphanumeric,'\0')
        ;
      }
      else {
        pcVar10 = get_win_string(memory,pFVar6,pTVar5 + local_38,sfnt_is_alphanumeric,'\0');
      }
      sVar11 = strlen(pcVar10);
      uVar9 = (uint)sVar11;
      if (0x5b < uVar9) {
        pcVar10[0x5b] = '\0';
        uVar9 = 0x5b;
      }
      face->var_postscript_prefix = pcVar10;
      face->var_postscript_prefix_len = uVar9;
      goto LAB_0021e322;
    }
LAB_0021e4d7:
    pcVar10 = (char *)0x0;
  }
  else {
LAB_0021e322:
    (**(code **)((long)pvVar7 + 0x40))(face,&local_3c,&mm_var,0,&stack0xffffffffffffffb0);
    uVar27 = (face->root).face_index & 0x7fff0000;
    if ((uVar27 == 0) || (((face->root).face_flags & 0x8000) != 0)) {
LAB_0021e4a4:
      lVar13 = *(long *)(lStack_50 + 0x10);
      pcVar10 = (char *)ft_mem_alloc(pFVar4,(ulong)(face->var_postscript_prefix_len +
                                                    local_3c * 0x11 + 1),(FT_Error *)(local_5c + 2))
      ;
      if (local_5c[2] != 0) goto LAB_0021e4d7;
      strcpy(pcVar10,face->var_postscript_prefix);
      pbVar29 = (byte *)(pcVar10 + face->var_postscript_prefix_len);
      if (local_3c != 0) {
        uVar9 = 0;
        pbVar25 = pbVar29;
        do {
          lVar28._0_4_ = mm_var->num_axis;
          lVar28._4_4_ = mm_var->num_designs;
          pbVar29 = pbVar25;
          if (lVar28 != *(long *)(lVar13 + 0x10)) {
            pbVar29 = pbVar25 + 1;
            *pbVar25 = 0x5f;
            uVar15 = mm_var->num_axis;
            if (uVar15 == 0) {
              pbVar25[1] = 0x30;
              pbVar29 = pbVar25 + 2;
            }
            else {
              if ((int)uVar15 < 0) {
                pbVar25[1] = 0x2d;
                pbVar29 = pbVar25 + 2;
                uVar15 = -uVar15;
              }
              if (0xffff < uVar15) {
                uVar20 = uVar15 >> 0x10;
                pbVar25 = (byte *)&local_68;
                do {
                  *pbVar25 = (char)uVar20 + (char)(uVar20 / 10) * -10 | 0x30;
                  pbVar25 = pbVar25 + 1;
                  bVar32 = 9 < uVar20;
                  uVar20 = uVar20 / 10;
                } while (bVar32);
                for (; &local_68 < pbVar25; pbVar25 = pbVar25 + -1) {
                  *pbVar29 = pbVar25[-1];
                  pbVar29 = pbVar29 + 1;
                }
              }
              if ((uVar15 & 0xffff) != 0) {
                *pbVar29 = 0x2e;
                lVar28 = 0;
                uVar15 = (uVar15 & 0xffff) * 10 + 5;
                do {
                  uVar19 = uVar15;
                  lVar31 = lVar28;
                  cVar2 = (char)(uVar19 >> 0x10);
                  bVar22 = cVar2 + 0x30;
                  pbVar29[lVar31 + 1] = bVar22;
                  uVar20 = uVar19 & 0xffff;
                  if (uVar20 == 0) {
                    if (lVar31 != 4) goto LAB_0021e64b;
                    if (bVar22 != 0x31) goto LAB_0021e636;
                    goto LAB_0021e62d;
                  }
                  lVar28 = lVar31 + 1;
                  uVar15 = uVar20 * 10;
                } while ((int)lVar28 != 5);
                if ((lVar28 == 5) && (uVar20 < 0x86b0)) {
                  if (bVar22 != 0x31) {
                    if (uVar20 == 0x4350) {
                      if ((uVar19 >> 0x10 & 1) != 0) {
LAB_0021e63f:
                        bVar22 = cVar2 + 0x2f;
                        pbVar29[lVar31 + 1] = bVar22;
                      }
                    }
                    else if (uVar20 < 0x4350) {
LAB_0021e636:
                      if (0xffff < uVar19) goto LAB_0021e63f;
                      goto LAB_0021e651;
                    }
                    goto LAB_0021e64b;
                  }
LAB_0021e62d:
                  pbVar29[lVar31 + 1] = 0x30;
LAB_0021e651:
                  pbVar25 = pbVar29 + lVar31 + 1;
                  do {
                    pbVar29 = pbVar25 + -1;
                    *pbVar25 = 0;
                    pbVar1 = pbVar25 + -1;
                    pbVar25 = pbVar29;
                  } while (*pbVar1 == 0x30);
                }
                else {
LAB_0021e64b:
                  if (bVar22 == 0x30) goto LAB_0021e651;
                  pbVar29 = pbVar29 + lVar31 + 1;
                }
                pbVar29 = pbVar29 + 1;
              }
            }
            uVar21 = *(undefined8 *)(lVar13 + 0x20);
            if (((uint)((ulong)uVar21 >> 0x18) & 0xff) != 0x20) {
              bVar22 = (byte)((ulong)uVar21 >> 0x18);
              iVar17 = (int)(char)bVar22;
              if (iVar17 - 0x61U < 0x1a || (iVar17 - 0x41U < 0x1a || iVar17 - 0x30U < 10)) {
                *pbVar29 = bVar22;
                pbVar29 = pbVar29 + 1;
                uVar21 = *(undefined8 *)(lVar13 + 0x20);
              }
            }
            bVar22 = (byte)((ulong)uVar21 >> 0x10);
            if ((bVar22 != 0x20) &&
               (iVar17 = (int)(char)bVar22,
               iVar17 - 0x61U < 0x1a || (iVar17 - 0x41U < 0x1a || iVar17 - 0x30U < 10))) {
              *pbVar29 = bVar22;
              pbVar29 = pbVar29 + 1;
              uVar21 = *(undefined8 *)(lVar13 + 0x20);
            }
            bVar22 = (byte)((ulong)uVar21 >> 8);
            if ((bVar22 != 0x20) &&
               (iVar17 = (int)(char)bVar22,
               iVar17 - 0x61U < 0x1a || (iVar17 - 0x41U < 0x1a || iVar17 - 0x30U < 10))) {
              *pbVar29 = bVar22;
              pbVar29 = pbVar29 + 1;
              uVar21 = *(undefined8 *)(lVar13 + 0x20);
            }
            bVar22 = (byte)uVar21;
            if ((bVar22 != 0x20) &&
               (iVar17 = (int)(char)bVar22,
               iVar17 - 0x61U < 0x1a || (iVar17 - 0x41U < 0x1a || iVar17 - 0x30U < 10))) {
              *pbVar29 = bVar22;
              pbVar29 = pbVar29 + 1;
            }
          }
          uVar9 = uVar9 + 1;
          mm_var = (FT_MM_Var *)&mm_var->num_namedstyles;
          lVar13 = lVar13 + 0x30;
          pbVar25 = pbVar29;
        } while (uVar9 < local_3c);
      }
    }
    else {
      pvVar7 = face->sfnt;
      lVar13 = *(long *)(lStack_50 + 0x18);
      lVar28 = ((uVar27 >> 0x10) - 1) * 0x10;
      iVar17 = *(int *)(lVar13 + 0xc + lVar28);
      local_68 = (char *)0x0;
      if (iVar17 == 6 || iVar17 - 0x100U < 0x7f00) {
        (**(code **)((long)pvVar7 + 0xe8))(face,(short)iVar17,&local_68);
        pcVar10 = local_68;
        if (local_68 == (char *)0x0) {
          lVar13 = *(long *)(lStack_50 + 0x18);
          goto LAB_0021e3cc;
        }
        sVar11 = strlen(local_68);
        pbVar29 = (byte *)(pcVar10 + sVar11 + 1);
      }
      else {
LAB_0021e3cc:
        (**(code **)((long)pvVar7 + 0xe8))(face,*(undefined2 *)(lVar13 + 8 + lVar28),local_78);
        if (local_78[0] == (char *)0x0) goto LAB_0021e4a4;
        FVar3 = face->var_postscript_prefix_len;
        sVar11 = strlen(local_78[0]);
        pcVar10 = (char *)ft_mem_alloc(pFVar4,sVar11 + (FVar3 + 1) + 1,(FT_Error *)(local_5c + 2));
        if (local_5c[2] != 0) goto LAB_0021e4d7;
        strcpy(pcVar10,face->var_postscript_prefix);
        pcVar30 = pcVar10 + (ulong)face->var_postscript_prefix_len + 1;
        pcVar10[face->var_postscript_prefix_len] = '-';
        cVar2 = *local_78[0];
        pcVar12 = local_78[0];
        while (cVar2 != '\0') {
          pcVar12 = pcVar12 + 1;
          iVar17 = (int)cVar2;
          if (iVar17 - 0x61U < 0x1a || (iVar17 - 0x41U < 0x1a || iVar17 - 0x30U < 10)) {
            *pcVar30 = cVar2;
            pcVar30 = pcVar30 + 1;
          }
          cVar2 = *pcVar12;
        }
        *pcVar30 = '\0';
        pbVar29 = (byte *)(pcVar30 + 1);
        ft_mem_free(pFVar4,local_78[0]);
      }
    }
    if (0x7f < (long)pbVar29 - (long)pcVar10) {
      uVar9 = (uint)((long)pbVar29 - (long)pcVar10);
      uVar15 = uVar9;
      if ((int)uVar9 < 0) {
        uVar15 = uVar9 + 0xf;
      }
      lVar13 = (long)(int)(uVar15 & 0xfffffff0);
      uVar20 = 0x75bcd15;
      uVar19 = 0x75bcd15;
      uVar18 = 0x75bcd15;
      uVar16 = 0x75bcd15;
      if (0x1e < uVar9 + 0xf) {
        lVar28 = (long)((int)uVar15 >> 4);
        piVar26 = (int *)(pcVar10 + lVar13 + lVar28 * -0x10 + 0xc);
        uVar18 = 0x75bcd15;
        uVar19 = 0x75bcd15;
        uVar20 = 0x75bcd15;
        do {
          uVar16 = ((uint)(piVar26[-3] * 0x239b961b) >> 0x11 | piVar26[-3] * -0x34f28000) *
                   -0x54f16877 ^ uVar16;
          iVar17 = (uVar16 << 0x13 | uVar16 >> 0xd) + uVar18;
          uVar16 = iVar17 * 5 + 0x561ccd1b;
          uVar18 = ((uint)(piVar26[-2] * -0x54f16877) >> 0x10 | piVar26[-2] * -0x68770000) *
                   0x38b34ae5 ^ uVar18;
          uVar18 = ((uVar18 << 0x11 | uVar18 >> 0xf) + uVar19) * 5 + 0xbcaa747;
          uVar19 = ((uint)(piVar26[-1] * 0x38b34ae5) >> 0xf | piVar26[-1] * -0x6a360000) *
                   -0x5e1c746d ^ uVar19;
          uVar19 = ((uVar19 << 0xf | uVar19 >> 0x11) + uVar20) * 5 + 0x96cd1c35;
          uVar20 = ((uint)(*piVar26 * -0x5e1c746d) >> 0xe | *piVar26 * 0x2e4c0000) * 0x239b961b ^
                   uVar20;
          uVar20 = ((uVar20 << 0xd | uVar20 >> 0x13) + iVar17 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
          piVar26 = piVar26 + 4;
          lVar28 = lVar28 + -1;
        } while (lVar28 != 0);
      }
      uVar23 = 0;
      uVar15 = 0;
      switch(uVar9 & 0xf) {
      case 0xf:
        uVar15 = (uint)(byte)pcVar10[lVar13 + 0xe] << 0x10;
      case 0xe:
        uVar15 = uVar15 | (uint)(byte)pcVar10[lVar13 + 0xd] << 8;
      case 0xd:
        uVar20 = uVar20 ^ (((byte)pcVar10[lVar13 + 0xc] ^ uVar15) * -0x5e1c746d >> 0xe |
                          ((byte)pcVar10[lVar13 + 0xc] ^ uVar15) * 0x2e4c0000) * 0x239b961b;
      case 0xc:
        uVar15 = (uint)(byte)pcVar10[lVar13 + 0xb] << 0x18;
      case 0xb:
        uVar15 = uVar15 | (uint)(byte)pcVar10[lVar13 + 10] << 0x10;
      case 10:
        uVar15 = uVar15 ^ (uint)(byte)pcVar10[lVar13 + 9] << 8;
      case 9:
        uVar19 = uVar19 ^ (((byte)pcVar10[lVar13 + 8] ^ uVar15) * 0x38b34ae5 >> 0xf |
                          ((byte)pcVar10[lVar13 + 8] ^ uVar15) * -0x6a360000) * -0x5e1c746d;
      case 8:
        uVar15 = (uint)(byte)pcVar10[lVar13 + 7] << 0x18;
      case 7:
        uVar15 = uVar15 | (uint)(byte)pcVar10[lVar13 + 6] << 0x10;
      case 6:
        uVar15 = uVar15 ^ (uint)(byte)pcVar10[lVar13 + 5] << 8;
      case 5:
        uVar18 = uVar18 ^ (((byte)pcVar10[lVar13 + 4] ^ uVar15) * -0x54f16877 >> 0x10 |
                          ((byte)pcVar10[lVar13 + 4] ^ uVar15) * -0x68770000) * 0x38b34ae5;
      case 4:
        uVar15 = (uint)(byte)pcVar10[lVar13 + 3] << 0x18;
      case 3:
        uVar23 = uVar15 | (uint)(byte)pcVar10[lVar13 + 2] << 0x10;
      case 2:
        uVar23 = uVar23 ^ (uint)(byte)pcVar10[lVar13 + 1] << 8;
      case 1:
        uVar16 = uVar16 ^ (((byte)pcVar10[lVar13] ^ uVar23) * 0x239b961b >> 0x11 |
                          ((byte)pcVar10[lVar13] ^ uVar23) * -0x34f28000) * -0x54f16877;
      case 0:
        uVar16 = (uVar16 ^ uVar9) + (uVar19 ^ uVar9) + (uVar18 ^ uVar9) + (uVar20 ^ uVar9);
        uVar18 = (uVar18 ^ uVar9) + uVar16;
        uVar15 = (uVar19 ^ uVar9) + uVar16;
        uVar9 = (uVar20 ^ uVar9) + uVar16;
        uVar20 = (uVar16 >> 0x10 ^ uVar16) * -0x7a143595;
        uVar19 = (uVar20 >> 0xd ^ uVar20) * -0x3d4d51cb;
        uVar20 = (uVar18 >> 0x10 ^ uVar18) * -0x7a143595;
        uVar20 = (uVar20 >> 0xd ^ uVar20) * -0x3d4d51cb;
        uVar20 = uVar20 >> 0x10 ^ uVar20;
        uVar15 = (uVar15 >> 0x10 ^ uVar15) * -0x7a143595;
        uVar15 = (uVar15 >> 0xd ^ uVar15) * -0x3d4d51cb;
        uVar15 = uVar15 >> 0x10 ^ uVar15;
        uVar9 = (uVar9 >> 0x10 ^ uVar9) * -0x7a143595;
        uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
        uVar9 = uVar9 >> 0x10 ^ uVar9;
        iVar17 = (uVar19 >> 0x10 ^ uVar19) + uVar20 + uVar15 + uVar9;
        puVar14 = local_5c;
        local_68 = (char *)CONCAT44(uVar20 + iVar17,iVar17);
        win = uVar15 + iVar17;
        local_5c[0] = uVar9 + iVar17;
        pcVar30 = pcVar10 + face->var_postscript_prefix_len;
        pcVar12 = pcVar30 + 0x20;
        *pcVar30 = '-';
        pcVar30[0x21] = '.';
        pcVar30[0x22] = '.';
        pcVar30[0x23] = '.';
        pcVar30[0x24] = '\0';
        iVar17 = 0;
        do {
          uVar9 = *puVar14;
          iVar24 = 8;
          do {
            *pcVar12 = "0123456789ABCDEF"[uVar9 & 0xf];
            pcVar12 = pcVar12 + -1;
            uVar9 = uVar9 >> 4;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
          iVar17 = iVar17 + 1;
          puVar14 = puVar14 + -1;
        } while (iVar17 != 4);
      }
    }
  }
LAB_0021eb2e:
  face->postscript_name = pcVar10;
  return pcVar10;
}

Assistant:

static const char*
  sfnt_get_ps_name( TT_Face  face )
  {
    FT_Int       found, win, apple;
    const char*  result = NULL;


    if ( face->postscript_name )
      return face->postscript_name;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->blend                                 &&
         ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) ||
           FT_IS_VARIATION( FT_FACE( face ) )      ) )
    {
      face->postscript_name = sfnt_get_var_ps_name( face );
      return face->postscript_name;
    }
#endif

    /* scan the name table to see whether we have a Postscript name here, */
    /* either in Macintosh or Windows platform encodings                  */
    found = sfnt_get_name_id( face, TT_NAME_ID_PS_NAME, &win, &apple );
    if ( !found )
      return NULL;

    /* prefer Windows entries over Apple */
    if ( win != -1 )
      result = get_win_string( face->root.memory,
                               face->name_table.stream,
                               face->name_table.names + win,
                               sfnt_is_postscript,
                               1 );
    else
      result = get_apple_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + apple,
                                 sfnt_is_postscript,
                                 1 );

    face->postscript_name = result;

    return result;
  }